

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::TimestampType::write(TimestampType *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  ssize_t sVar10;
  void *__buf_00;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (TProtocol *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),T_STOP,
                     0x6f);
  uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeBool
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (bool)in_stack_ffffffffffffff9f);
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x6f9d57);
  uVar5 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),T_STOP,
                     0x6f);
  sVar10 = TimeUnit::write(&this->unit,__fd,__buf_00,(ulong)uVar5);
  uVar6 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x6f9dcb);
  uVar7 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x6f9de9);
  uVar8 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x6f9e07);
  uVar9 = uVar8 + uVar1 + uVar2 + uVar3 + uVar4 + uVar5 + (int)sVar10 + uVar6 + uVar7;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x6f9e2b);
  return (ulong)uVar9;
}

Assistant:

uint32_t TimestampType::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("TimestampType");

  xfer += oprot->writeFieldBegin("isAdjustedToUTC", ::apache::thrift::protocol::T_BOOL, 1);
  xfer += oprot->writeBool(this->isAdjustedToUTC);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("unit", ::apache::thrift::protocol::T_STRUCT, 2);
  xfer += this->unit.write(oprot);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}